

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall Camera::move_left(Camera *this,float delta_time)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  vec<3,_float,_(glm::qualifier)0> local_30;
  vec<3,_float,_(glm::qualifier)0> local_20;
  float local_14;
  Camera *pCStack_10;
  float delta_time_local;
  Camera *this_local;
  
  local_14 = delta_time;
  pCStack_10 = this;
  vVar1 = glm::operator*(&this->right,delta_time);
  local_40.field_2 = vVar1.field_2;
  local_30.field_2 = local_40.field_2;
  local_40._0_8_ = vVar1._0_8_;
  local_30.field_0 = local_40.field_0;
  local_30.field_1 = local_40.field_1;
  vVar1 = glm::operator*(&local_30,this->speed);
  local_50._0_8_ = vVar1._0_8_;
  local_20.field_0 = local_50.field_0;
  local_20.field_1 = local_50.field_1;
  local_50.field_2 = vVar1.field_2;
  local_20.field_2 = local_50.field_2;
  glm::vec<3,float,(glm::qualifier)0>::operator-=((vec<3,float,(glm::qualifier)0> *)this,&local_20);
  return;
}

Assistant:

void Camera::move_left(float delta_time) {
    position -= right * delta_time * speed;
}